

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::getp_getFileInfo(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  undefined8 uVar1;
  int iVar2;
  int32_t iVar3;
  vm_obj_id_t vVar4;
  vm_val_t *pvVar5;
  undefined8 *puVar6;
  long *plVar7;
  CVmObject *pCVar8;
  int *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t fi;
  int argc_1;
  char target [4096];
  err_frame_t err_cur__;
  os_file_stat_t stat;
  int ok;
  int follow_links;
  CVmNetFile *netfile;
  vm_rcdesc rc;
  uint argc;
  undefined4 in_stack_ffffffffffffedf8;
  uint32_t in_stack_ffffffffffffedfc;
  CVmRun *in_stack_ffffffffffffee00;
  vm_val_t *in_stack_ffffffffffffee08;
  os_filetype_t in_stack_ffffffffffffee10;
  int in_stack_ffffffffffffee14;
  vm_rcdesc *in_stack_ffffffffffffee18;
  CCharmapToUni *cmap;
  uint argc_00;
  vm_val_t *in_stack_ffffffffffffee20;
  undefined8 in_stack_ffffffffffffee30;
  void *pvVar9;
  int in_root_set;
  int local_11bc;
  CCharmapToUni local_11a8 [256];
  uint local_1a8 [2];
  undefined8 local_1a0;
  void *local_198;
  __jmp_buf_tag _Stack_190;
  uint local_c8;
  int local_c4;
  ulong local_a8;
  unsigned_long local_a0;
  int local_98;
  int local_94;
  CVmNetFile *local_90;
  int local_2c;
  vm_val_t *local_20;
  
  in_root_set = (int)((ulong)in_stack_ffffffffffffee30 >> 0x20);
  if (in_RCX == (int *)0x0) {
    local_11bc = 0;
  }
  else {
    local_11bc = *in_RCX;
  }
  local_2c = local_11bc;
  local_20 = in_RDX;
  if ((getp_getFileInfo(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_getFileInfo(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getFileInfo::desc,0);
    __cxa_guard_release(&getp_getFileInfo(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffee08,(uint *)in_stack_ffffffffffffee00,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
  if (iVar2 == 0) {
    CVmMetaclass::get_class_obj
              ((CVmMetaclass *)CONCAT44(in_stack_ffffffffffffee14,in_stack_ffffffffffffee10));
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              ((vm_rcdesc *)CONCAT44(in_stack_ffffffffffffee14,in_stack_ffffffffffffee10),
               (char *)in_stack_ffffffffffffee08,
               (vm_obj_id_t)((ulong)in_stack_ffffffffffffee00 >> 0x20),
               (unsigned_short)((ulong)in_stack_ffffffffffffee00 >> 0x10),
               (vm_val_t *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8),0);
    local_90 = CVmObjFile::get_filename_from_obj
                         ((vm_obj_id_t)((ulong)in_stack_ffffffffffffee20 >> 0x20),
                          in_stack_ffffffffffffee18,in_stack_ffffffffffffee14,
                          in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08);
    argc_00 = (uint)((ulong)in_stack_ffffffffffffee18 >> 0x20);
    local_94 = 1;
    if (local_2c != 0) {
      pvVar5 = CVmStack::get(0);
      local_94 = vm_val_t::get_logical(pvVar5);
      pvVar5 = CVmStack::get(0);
      iVar2 = vm_val_t::is_logical(pvVar5);
      if (iVar2 == 0) {
        err_throw(0);
      }
    }
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    local_1a0 = *puVar6;
    plVar7 = (long *)_ZTW11G_err_frame();
    *plVar7 = (long)local_1a8;
    local_1a8[0] = _setjmp(&_Stack_190);
    if (local_1a8[0] == 0) {
      local_98 = CVmNetFile::get_file_stat
                           ((CVmNetFile *)in_stack_ffffffffffffee00,
                            (os_file_stat_t *)
                            CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8),0);
    }
    if ((local_1a8[0] & 0x8000) == 0) {
      local_1a8[0] = local_1a8[0] | 0x8000;
      CVmNetFile::abandon((CVmNetFile *)in_stack_ffffffffffffee00);
    }
    uVar1 = local_1a0;
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    *puVar6 = uVar1;
    if ((local_1a8[0] & 0x4001) != 0) {
      puVar6 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar6 & 2) != 0) {
        plVar7 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar7 + 0x10));
      }
      pvVar9 = local_198;
      plVar7 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar7 + 0x10) = pvVar9;
      err_rethrow();
      in_root_set = (int)((ulong)pvVar9 >> 0x20);
    }
    if ((local_1a8[0] & 2) != 0) {
      free(local_198);
    }
    if (local_98 == 0) {
      vm_val_t::set_nil(local_20);
    }
    else {
      pvVar5 = CVmStack::push();
      iVar3 = map_file_attrs(local_a0);
      vm_val_t::set_int(pvVar5,iVar3);
      if (((local_a8 & 0xa000) == 0) ||
         (iVar2 = CVmNetFile::resolve_symlink
                            ((CVmNetFile *)in_stack_ffffffffffffee00,
                             (char *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8),
                             0x2e7834), iVar2 == 0)) {
        pvVar5 = CVmStack::push();
        vm_val_t::set_nil(pvVar5);
      }
      else {
        in_stack_ffffffffffffee20 = CVmStack::push();
        cmap = local_11a8;
        strlen((char *)local_11a8);
        vVar4 = CVmObjString::create
                          (in_root_set,(char *)pvVar5,(size_t)in_stack_ffffffffffffee20,cmap);
        argc_00 = (uint)((ulong)cmap >> 0x20);
        vm_val_t::set_obj(in_stack_ffffffffffffee20,vVar4);
      }
      push_file_time((time_t)in_stack_ffffffffffffee00);
      push_file_time((time_t)in_stack_ffffffffffffee00);
      push_file_time((time_t)in_stack_ffffffffffffee00);
      if ((local_c4 == 0) && (local_c8 < 0x80000000)) {
        CVmRun::push_int(in_stack_ffffffffffffee00,in_stack_ffffffffffffedfc);
      }
      else {
        CVmObjBigNum::create_int64
                  ((int)((ulong)in_stack_ffffffffffffee00 >> 0x20),
                   (uint32_t)in_stack_ffffffffffffee00,in_stack_ffffffffffffedfc);
        CVmRun::push_obj(in_stack_ffffffffffffee00,in_stack_ffffffffffffedfc);
      }
      iVar3 = filemode_to_filetype((int)local_a8);
      special_filetype_flags((CVmObjFileName *)CONCAT44(iVar3,in_stack_ffffffffffffee10));
      CVmRun::push_int(in_stack_ffffffffffffee00,in_stack_ffffffffffffedfc);
      vVar4 = G_predef_X.file_info;
      if (G_predef_X.file_info == 0) {
        vVar4 = CVmObjList::create_from_stack((uchar **)in_stack_ffffffffffffee20,argc_00);
        vm_val_t::set_obj(local_20,vVar4);
      }
      else {
        pCVar8 = vm_objp(0);
        (*pCVar8->_vptr_CVmObject[3])(pCVar8,(ulong)vVar4,0,7);
        pvVar5 = CVmRun::get_r0();
        if (pvVar5->typ != VM_OBJ) {
          err_throw(0);
        }
        pvVar5 = CVmRun::get_r0();
        vm_val_t::set_obj(local_20,(pvVar5->val).obj);
      }
    }
    CVmStack::discard(local_2c);
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_getFileInfo(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the GETINFO access mode */
    vm_rcdesc rc(vmg_ "FileName.getFileInfo",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_GETFILEINFO, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_GETINFO,
        OSFTUNK, "application/octet-stream");

    /* check to see if we're following links (follow them by default) */
    int follow_links = TRUE;
    if (argc >= 1)
    {
        /* 
         *   note that our 'asLink' parameter has the opposite sense from
         *   'follow_links', so invert the parameter value 
         */
        follow_links = G_stk->get(0)->get_logical();
        if (!G_stk->get(0)->is_logical())
            err_throw(VMERR_BAD_VAL_BIF);
    }

    int ok;
    os_file_stat_t stat;
    err_try
    {
        /* get the file type from the netfile object */
        ok = netfile->get_file_stat(vmg_ &stat, follow_links);
    }